

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Xml.cpp
# Opt level: O3

bool __thiscall Xml::Private::parse(Private *this,char *data,Element *element)

{
  usize *puVar1;
  int iVar2;
  char *pcVar3;
  bool bVar4;
  char *pcVar5;
  char *pcVar6;
  String local_58;
  
  (this->pos).line = 1;
  (this->pos).lineStart = data;
  (this->pos).pos = data;
  skipSpace(this);
  pcVar6 = (this->pos).pos;
  if (*pcVar6 == '<') {
    while (pcVar6[1] == '?') {
      iVar2 = (this->pos).line;
      pcVar3 = (this->pos).lineStart;
      pcVar5 = pcVar6 + 2;
      (this->pos).pos = pcVar5;
      while( true ) {
        pcVar5 = String::findOneOf(pcVar5,"\r\n?");
        if (pcVar5 == (char *)0x0) {
          local_58.data = &local_58._data;
          local_58._data.ref = 0;
          local_58._data.str = "Unexpected end of file";
          local_58._data.len = 0x16;
          this->errorLine = iVar2;
          this->errorColumn = ((int)pcVar6 - (int)pcVar3) + 1;
          String::operator=(&this->errorString,&local_58);
          goto LAB_001082a5;
        }
        if ((*pcVar5 == '?') && (pcVar5[1] == '>')) break;
        (this->pos).pos = pcVar5 + 1;
        skipSpace(this);
        pcVar5 = (this->pos).pos;
      }
      (this->pos).pos = pcVar5 + 2;
      skipSpace(this);
      pcVar6 = (this->pos).pos;
      if (*pcVar6 != '<') break;
    }
  }
  bVar4 = readToken(this);
  if (bVar4) {
    if ((this->token).type == startTagBeginType) {
      bVar4 = parseElement(this,element);
      return bVar4;
    }
    local_58.data = &local_58._data;
    local_58._data.ref = 0;
    local_58._data.str = "Expected \'<\'";
    local_58._data.len = 0xc;
    iVar2 = *(int *)&(this->token).pos.pos;
    this->errorLine = (this->token).pos.line;
    this->errorColumn = (iVar2 - *(int *)&(this->token).pos.lineStart) + 1;
    String::operator=(&this->errorString,&local_58);
LAB_001082a5:
    if ((local_58.data)->ref != 0) {
      LOCK();
      puVar1 = &(local_58.data)->ref;
      *puVar1 = *puVar1 - 1;
      UNLOCK();
      if ((*puVar1 == 0) && (local_58.data != (Data *)0x0)) {
        operator_delete__(local_58.data);
      }
    }
  }
  return false;
}

Assistant:

bool Xml::Private::parse(const char* data, Element& element)
{
  pos.line = 1;
  pos.pos = pos.lineStart = data;

  skipSpace();
  while(*pos.pos == '<' && pos.pos[1] == '?')
  {
    Position startPos = pos;
    pos.pos += 2;
    for(;;)
    {
      const char* end = String::findOneOf(pos.pos, "\r\n?");
      if(!end)
        return this->syntaxError(startPos, "Unexpected end of file"), false;
      if(*end == '?' && end[1] == '>')
      {
        pos.pos = end + 2;
        break;
      }
      pos.pos = end + 1;
      skipSpace();
    }
    skipSpace();
  }
  if(!readToken())
    return false;
  if(token.type != Token::startTagBeginType)
    return syntaxError(token.pos, "Expected '<'"), false;
  return parseElement(element);
}